

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitLoad(FunctionValidator *this,Load *curr)

{
  bool bVar1;
  Module *pMVar2;
  address64_t align;
  bool local_79;
  BasicType local_40 [4];
  address64_t local_30;
  address64_t local_28;
  Memory *local_20;
  Memory *memory;
  Load *curr_local;
  FunctionValidator *this_local;
  
  memory = (Memory *)curr;
  curr_local = (Load *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  local_30 = (memory->initial).addr;
  local_28 = (memory->max).addr;
  local_20 = Module::getMemoryOrNull(pMVar2,(IString)*(IString *)&memory->initial);
  shouldBeTrue<wasm::Load*>
            (this,local_20 != (Memory *)0x0,(Load *)memory,"memory.load memory must exist");
  if (((memory->super_Importable).base.super_IString.str._M_len & 1) != 0) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    bVar1 = FeatureSet::hasAtomics(&pMVar2->features);
    shouldBeTrue<wasm::Load*>
              (this,bVar1,(Load *)memory,"Atomic operations require threads [--enable-threads]");
    local_40[3] = 2;
    bVar1 = wasm::Type::operator==
                      ((Type *)&(memory->super_Importable).super_Named.name.super_IString.str._M_str
                       ,local_40 + 3);
    local_79 = true;
    if (!bVar1) {
      local_40[2] = 3;
      bVar1 = wasm::Type::operator==
                        ((Type *)&(memory->super_Importable).super_Named.name.super_IString.str.
                                  _M_str,local_40 + 2);
      local_79 = true;
      if (!bVar1) {
        local_40[1] = 1;
        local_79 = wasm::Type::operator==
                             ((Type *)&(memory->super_Importable).super_Named.name.super_IString.str
                                       ._M_str,local_40 + 1);
      }
    }
    shouldBeTrue<wasm::Load*>(this,local_79,(Load *)memory,"Atomic load should be i32 or i64");
  }
  local_40[0] = v128;
  bVar1 = wasm::Type::operator==
                    ((Type *)&(memory->super_Importable).super_Named.name.super_IString.str._M_str,
                     local_40);
  if (bVar1) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    bVar1 = FeatureSet::hasSIMD(&pMVar2->features);
    shouldBeTrue<wasm::Load*>
              (this,bVar1,(Load *)memory,"SIMD operations require SIMD [--enable-simd]");
  }
  validateMemBytes(this,(memory->super_Importable).super_Named.hasExplicitName,
                   (Type)(memory->super_Importable).super_Named.name.super_IString.str._M_str,
                   (Expression *)memory);
  validateOffset(this,(Address)(memory->super_Importable).module.super_IString.str._M_len,local_20,
                 (Expression *)memory);
  align = wasm::Address::operator_cast_to_unsigned_long
                    ((Address *)&(memory->super_Importable).module.super_IString.str._M_str);
  validateAlignment(this,align,
                    (Type)(memory->super_Importable).super_Named.name.super_IString.str._M_str,
                    (uint)(memory->super_Importable).super_Named.hasExplicitName,
                    (bool)((byte)(memory->super_Importable).base.super_IString.str._M_len & 1),
                    (Expression *)memory);
  shouldBeEqualOrFirstIsUnreachable<wasm::Load*,wasm::Type>
            (this,(Type)*(uintptr_t *)((memory->super_Importable).base.super_IString.str._M_str + 8)
             ,(Type)(local_20->addressType).id,(Load *)memory,
             "load pointer type must match memory index type");
  if (((memory->super_Importable).base.super_IString.str._M_len & 1) != 0) {
    shouldBeFalse<wasm::Load*>
              (this,(bool)((memory->super_Importable).super_Named.field_0x11 & 1),(Load *)memory,
               "atomic loads must be unsigned");
    shouldBeIntOrUnreachable
              (this,(Type)(memory->super_Importable).super_Named.name.super_IString.str._M_str,
               (Expression *)memory,"atomic loads must be of integers");
  }
  return;
}

Assistant:

void FunctionValidator::visitLoad(Load* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.load memory must exist");
  if (curr->isAtomic) {
    shouldBeTrue(getModule()->features.hasAtomics(),
                 curr,
                 "Atomic operations require threads [--enable-threads]");
    shouldBeTrue(curr->type == Type::i32 || curr->type == Type::i64 ||
                   curr->type == Type::unreachable,
                 curr,
                 "Atomic load should be i32 or i64");
  }
  if (curr->type == Type::v128) {
    shouldBeTrue(getModule()->features.hasSIMD(),
                 curr,
                 "SIMD operations require SIMD [--enable-simd]");
  }
  validateMemBytes(curr->bytes, curr->type, curr);
  validateOffset(curr->offset, memory, curr);
  validateAlignment(curr->align, curr->type, curr->bytes, curr->isAtomic, curr);
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    memory->addressType,
    curr,
    "load pointer type must match memory index type");
  if (curr->isAtomic) {
    shouldBeFalse(curr->signed_, curr, "atomic loads must be unsigned");
    shouldBeIntOrUnreachable(
      curr->type, curr, "atomic loads must be of integers");
  }
}